

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FirewirePort.cpp
# Opt level: O0

bool __thiscall
FirewirePort::ReadBlockNode
          (FirewirePort *this,nodeid_t node,nodeaddr_t addr,quadlet_t *rdata,uint nbytes,
          uchar param_5)

{
  int iVar1;
  allocator<char> local_59;
  string local_58 [35];
  uchar local_35;
  uint local_34;
  uchar param_5_local;
  quadlet_t *pqStack_30;
  uint nbytes_local;
  quadlet_t *rdata_local;
  nodeaddr_t addr_local;
  FirewirePort *pFStack_18;
  nodeid_t node_local;
  FirewirePort *this_local;
  
  local_35 = param_5;
  local_34 = nbytes;
  pqStack_30 = rdata;
  rdata_local = (quadlet_t *)addr;
  addr_local._6_2_ = node;
  pFStack_18 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"FirewirePort::ReadBlock",&local_59);
  iVar1 = (*(this->super_BasePort)._vptr_BasePort[0x1b])(this,local_58,0);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  if ((((byte)iVar1 ^ 0xff) & 1) == 0) {
    (this->super_BasePort).rtRead = true;
    iVar1 = raw1394_read(this->handle,this->baseNodeId + addr_local._6_2_,rdata_local,local_34,
                         pqStack_30);
    this_local._7_1_ = iVar1 == 0;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FirewirePort::ReadBlockNode(nodeid_t node, nodeaddr_t addr, quadlet_t *rdata,
                                 unsigned int nbytes, unsigned char)
{
    if (!CheckFwBusGeneration("FirewirePort::ReadBlock"))
        return false;

    rtRead = true;   // for debugging
    return !raw1394_read(handle, baseNodeId+node, addr, nbytes, rdata);
}